

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_xmlAttributesWithNamespacePrefix_Test::Parser_xmlAttributesWithNamespacePrefix_Test
          (Parser_xmlAttributesWithNamespacePrefix_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00153cb0;
  return;
}

Assistant:

TEST(Parser, xmlAttributesWithNamespacePrefix)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" xmlns:foo=\"http://www.example.com/\" name=\"mymodel\">\n"
        "  <component foo:name=\"\"/>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssues = {
        "Element 'component' attribute 'name' has a namespace 'http://www.example.com/' specified.",
        "Component '' has an invalid attribute 'name'.",
        "Component does not specify a name attribute.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);

    EXPECT_EQ_ISSUES(expectedIssues, p);
}